

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga.c
# Opt level: O0

void xc_gga_exc_vxc_fxc(xc_func_type *p,size_t np,double *rho,double *sigma,double *zk,double *vrho,
                       double *vsigma,double *v2rho2,double *v2rhosigma,double *v2sigma2)

{
  undefined8 in_R8;
  undefined8 in_R9;
  xc_gga_out_params out;
  xc_gga_out_params *in_stack_000001b8;
  double *in_stack_000001c0;
  double *in_stack_000001c8;
  size_t in_stack_000001d0;
  int in_stack_000001dc;
  xc_func_type *in_stack_000001e0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_30;
  undefined8 local_28;
  
  local_30 = in_R9;
  local_28 = in_R8;
  memset(&local_a8,0,0x78);
  local_a8 = local_28;
  local_a0 = local_30;
  xc_gga_new(in_stack_000001e0,in_stack_000001dc,in_stack_000001d0,in_stack_000001c8,
             in_stack_000001c0,in_stack_000001b8);
  return;
}

Assistant:

void
xc_gga_exc_vxc_fxc (const xc_func_type *p, size_t np, const double *rho, const double *sigma,
                    double *zk, double *vrho, double *vsigma,
                    double *v2rho2, double *v2rhosigma, double *v2sigma2)
{
  xc_gga_out_params out;
  libxc_memset(&out, 0, sizeof(xc_gga_out_params));
  out.zk     = zk;
  out.vrho   = vrho; out.vsigma = vsigma;
  out.v2rho2 = v2rho2; out.v2rhosigma = v2rhosigma; out.v2sigma2 = v2sigma2;
  
  xc_gga_new(p, 2, np, rho, sigma, &out);
}